

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layoutnode.h
# Opt level: O1

void __thiscall rengine::LayoutEngine::updateLayout(LayoutEngine *this,Node *parentNode)

{
  byte bVar1;
  Node *pNVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  rect2d rect;
  float local_78;
  float local_58;
  float local_2c;
  
  bVar1 = this->field_0x28 & 3;
  if (1 < bVar1) {
    if (bVar1 == 2) {
      fVar16 = this->width;
      fVar18 = (float)(~-(uint)(fVar16 < 0.0) & 0x3f800000 | -(uint)(fVar16 < 0.0) & 0xbf800000);
      uVar8 = -(uint)(this->height < 0.0);
      local_58 = (float)(~uVar8 & 0x3f800000 | uVar8 & 0xbf800000);
      iVar6 = this->columnCount;
    }
    else {
      fVar16 = this->height;
      fVar18 = (float)(~-(uint)(fVar16 < 0.0) & 0x3f800000 | -(uint)(fVar16 < 0.0) & 0xbf800000);
      uVar8 = -(uint)(this->width < 0.0);
      local_58 = (float)(~uVar8 & 0x3f800000 | uVar8 & 0xbf800000);
      iVar6 = this->rowCount;
    }
    iVar7 = 0x7fffffff;
    if (0 < iVar6) {
      iVar7 = iVar6;
    }
    if ((fVar16 != 0.0) || (NAN(fVar16))) {
      fVar11 = this->margin * fVar18;
      fVar16 = fVar16 - (fVar11 + fVar11);
    }
    else {
      fVar16 = fVar18 * INFINITY;
    }
    pNVar2 = parentNode->m_child;
    if (pNVar2 == (Node *)0x0) {
      return;
    }
    local_78 = local_58 * this->margin;
    fVar11 = this->margin * fVar18;
    iVar6 = 0;
    local_2c = 0.0;
    do {
      if ((pNVar2->field_0x30 & 0x40) == 0) {
        pNVar2 = Node::sibling(pNVar2);
      }
      else {
        bVar1 = this->field_0x28 & 3;
        uVar4 = (ulong)(bVar1 != 2);
        fVar9 = (*(float *)((long)&pNVar2[1].super_SignalEmitter._vptr_SignalEmitter + uVar4 * 4 + 4
                           ) - *(float *)(&pNVar2->field_0x34 + uVar4 * 4)) * fVar18 + fVar11;
        if (iVar6 != 0 && (iVar7 <= iVar6 || fVar16 * fVar18 < fVar18 * fVar9)) {
          local_78 = local_78 + (this->spacing + local_2c) * local_58;
          fVar11 = this->margin * fVar18;
          iVar6 = 0;
        }
        else {
          if (bVar1 == 2) {
            fVar14 = fVar11;
            if (this->x + fVar18 <= 0.0) {
              fVar14 = fVar11 - (*(float *)((long)&pNVar2[1].super_SignalEmitter._vptr_SignalEmitter
                                           + 4) - *(float *)&pNVar2->field_0x34);
            }
            fVar11 = *(float *)&pNVar2[1].super_SignalEmitter.m_buckets -
                     *(float *)&pNVar2[1].super_SignalEmitter._vptr_SignalEmitter;
            fVar10 = fVar11;
            if (fVar11 <= local_2c) {
              fVar10 = local_2c;
            }
            uVar8 = -(uint)(0.0 < this->y + local_58);
            fVar11 = (float)(uVar8 & (uint)local_78 | ~uVar8 & (uint)(local_78 - fVar11));
            local_2c = fVar10;
          }
          else {
            if (this->y + fVar18 <= 0.0) {
              fVar11 = fVar11 - (*(float *)&pNVar2[1].super_SignalEmitter.m_buckets -
                                *(float *)&pNVar2[1].super_SignalEmitter._vptr_SignalEmitter);
            }
            fVar14 = *(float *)((long)&pNVar2[1].super_SignalEmitter._vptr_SignalEmitter + 4) -
                     *(float *)&pNVar2->field_0x34;
            fVar10 = fVar14;
            if (fVar14 <= local_2c) {
              fVar10 = local_2c;
            }
            uVar8 = -(uint)(0.0 < this->x + local_58);
            fVar14 = (float)(uVar8 & (uint)local_78 | ~uVar8 & (uint)(local_78 - fVar14));
            local_2c = fVar10;
          }
          RectangleNodeBase::setPosition((RectangleNodeBase *)pNVar2,fVar14,fVar11);
          iVar6 = iVar6 + 1;
          fVar11 = this->spacing * fVar18 + fVar9;
          pNVar2 = Node::sibling(pNVar2);
        }
      }
    } while (pNVar2 != (Node *)0x0);
    return;
  }
  fVar16 = this->cellWidth;
  if (((fVar16 == 0.0) && (!NAN(fVar16))) &&
     (((this->width == 0.0 && (!NAN(this->width))) || (this->columnCount < 1)))) {
    __assert_fail("cellWidth != 0 || (width != 0 && columnCount > 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/layoutnode.h"
                  ,0xdb,"void rengine::LayoutEngine::updateLayout(Node *)");
  }
  fVar18 = this->cellHeight;
  if ((fVar18 == 0.0) && (!NAN(fVar18))) {
    if (((this->height == 0.0) && (!NAN(this->height))) || (this->rowCount < 1)) {
      __assert_fail("cellHeight != 0 || (height != 0 && rowCount > 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/scenegraph/layoutnode.h"
                    ,0xdc,"void rengine::LayoutEngine::updateLayout(Node *)");
    }
    if ((fVar18 == 0.0) && (!NAN(fVar18))) {
      fVar16 = this->width;
      fVar11 = ((ABS(fVar16) - (this->margin + this->margin)) -
               (float)(this->columnCount + -1) * this->spacing) / (float)this->columnCount;
      goto LAB_0016ba7a;
    }
  }
  fVar11 = ABS(fVar16);
LAB_0016ba7a:
  if ((fVar18 != 0.0) || (NAN(fVar18))) {
    fVar9 = ABS(fVar18);
  }
  else {
    fVar18 = this->height;
    fVar9 = ((ABS(fVar18) - (this->margin + this->margin)) -
            (float)(this->rowCount + -1) * this->spacing) / (float)this->rowCount;
  }
  iVar6 = 0x7fffffff;
  if (0 < (&this->columnCount)[bVar1 != 0]) {
    iVar6 = (&this->columnCount)[bVar1 != 0];
  }
  pNVar2 = parentNode->m_child;
  if (pNVar2 != (Node *)0x0) {
    fVar16 = *(float *)(&DAT_0016d5d8 + (ulong)(0.0 < fVar16) * 4);
    fVar18 = *(float *)(&DAT_0016d378 + (ulong)(fVar18 < 0.0) * 4);
    iVar7 = 0;
    do {
      if ((pNVar2->field_0x30 & 0x40) != 0) {
        if ((this->field_0x28 & 3) == 0) {
          iVar5 = iVar7 / iVar6;
          iVar3 = iVar7 % iVar6;
        }
        else {
          iVar3 = iVar7 / iVar6;
          iVar5 = iVar7 % iVar6;
        }
        fVar12 = ((float)iVar3 * this->spacing + (float)iVar3 * fVar11 + this->margin) * fVar16 +
                 this->x;
        fVar15 = ((float)iVar5 * this->spacing + (float)iVar5 * fVar9 + this->margin) * fVar18 +
                 this->y;
        fVar10 = fVar16 * fVar11 + fVar12;
        fVar13 = fVar18 * fVar9 + fVar15;
        fVar14 = fVar10;
        if (fVar12 <= fVar10) {
          fVar14 = fVar12;
        }
        fVar17 = fVar13;
        if (fVar15 <= fVar13) {
          fVar17 = fVar15;
        }
        rect.tl.y = fVar17;
        rect.tl.x = fVar14;
        if (fVar10 <= fVar12) {
          fVar10 = fVar12;
        }
        if (fVar13 <= fVar15) {
          fVar13 = fVar15;
        }
        rect.br.y = fVar13;
        rect.br.x = fVar10;
        RectangleNodeBase::setGeometry((RectangleNodeBase *)pNVar2,rect);
        iVar7 = iVar7 + 1;
      }
      pNVar2 = Node::sibling(pNVar2);
    } while (pNVar2 != (Node *)0x0);
  }
  return;
}

Assistant:

void LayoutEngine::updateLayout(Node *parentNode)
{
    if (layoutType == Grid_Horizontal || layoutType == Grid_Vertical) {
        assert(cellWidth != 0 || (width != 0 && columnCount > 0));
        assert(cellHeight != 0 || (height != 0 && rowCount > 0));

        int index = 0;

        float cw, ch, xSign, ySign;

        if (cellHeight != 0) {
             cw = std::abs(cellWidth);
             xSign = cellWidth > 0 ? 1 : -1;
        } else {
            cw = (std::abs(width) - 2 * margin - (columnCount - 1) * spacing) / columnCount;
            xSign = width > 0 ? 1 : -1;
        }

        if (cellHeight != 0) {
            ch = std::abs(cellHeight);
            ySign = cellHeight < 0 ? -1 : 1;
        } else {
            ch = (std::abs(height) - 2 * margin - (rowCount - 1) * spacing) / rowCount;
            ySign = height < 0 ? -1 : 1;
        }

        logd << (layoutType == Grid_Horizontal ? "horizontal" : "vertical")
             << "-grid: cell=" << cw << "x" << ch
             << ", dim=" << width << "x" << height << ", margin=" << margin << ", spacing=" << spacing
             << std::endl;

        const int itemsPer = layoutType == Grid_Horizontal
                             ? (columnCount > 0 ? columnCount : std::numeric_limits<int>::max())
                             : (rowCount > 0 ? rowCount : std::numeric_limits<int>::max());
        Node *node = parentNode->child();
        while (node) {
            RectangleNodeBase *rectNode = RectangleNodeBase::from(node);
            if (rectNode) {
                int r, c;
                if (layoutType == Grid_Horizontal) {
                    r = index / itemsPer;
                    c = index % itemsPer;
                } else {
                    r = index % itemsPer;
                    c = index / itemsPer;
                }

                rectNode->setGeometry(rect2d::fromXywh(x + xSign * (margin + c * cw + c * spacing),
                                                       y + ySign * (margin + r * ch + r * spacing),
                                                       xSign * cw,
                                                       ySign * ch).normalized());
                ++index;
            }
            node = node->sibling();
        }

    } else {

        int index = 0;
        int itemLimit;
        float sizeLimit;

        float posSign, offsetSign;

        if (layoutType == Flow_Horizontal) {
            posSign = width < 0 ? -1 : 1;
            offsetSign = height < 0 ? -1 : 1;
            itemLimit = columnCount > 0 ? columnCount : std::numeric_limits<int>::max();
            sizeLimit = width != 0 ? width - posSign * margin * 2 : posSign * std::numeric_limits<float>::infinity();
        } else {
            posSign = height < 0 ? -1 : 1;
            offsetSign = width < 0 ? -1 : 1;
            itemLimit = rowCount > 0 ? rowCount : std::numeric_limits<int>::max();
            sizeLimit = height != 0 ? height - posSign * margin * 2 : posSign * std::numeric_limits<float>::infinity();
        }

        float pos = posSign * margin; // The position to place the node on the current line
        float offset = offsetSign * margin; // The position in the direction normal to the pos
        float offsetIncrement = 0;

        logd << (layoutType == Flow_Horizontal ? "horizontal" : "vertical")
             << "-flow: itemLimit=" << itemLimit << ", sizeLimit=" << sizeLimit
             << ", margin=" << margin << ", spacing=" << spacing
             << std::endl;

        Node *node = parentNode->child();
        while (node) {
            RectangleNodeBase *rectNode = RectangleNodeBase::from(node);
            if (rectNode) {
                float dim = layoutType == Flow_Horizontal ? rectNode->width() : rectNode->height();
                float end = pos + posSign * dim;
                bool fitsOnLine = (posSign * end <= posSign * sizeLimit && index < itemLimit);
                logd << " - pos=" << pos << ", dim=" << dim << ", end=" << end  << ", index=" << index << ", fitsOnLine=" << fitsOnLine << std::endl;

                if (fitsOnLine || index == 0) {
                    if (layoutType == Flow_Horizontal) {
                        offsetIncrement = std::max(offsetIncrement, rectNode->height());
                        rectNode->setPosition(x + posSign > 0 ? pos : pos - rectNode->width(),
                                              y + offsetSign > 0 ? offset : offset - rectNode->height());
                    } else {
                        offsetIncrement = std::max(offsetIncrement, rectNode->width());
                        rectNode->setPosition(x + offsetSign > 0 ? offset : offset - rectNode->width(),
                                              y + posSign > 0 ? pos : pos - rectNode->height());
                    }
                    ++index;
                    pos = end + posSign * spacing;
                    node = node->sibling();
                } else {
                    // If it doesn't fit, wrap to the next line..
                    offset += offsetSign * (offsetIncrement + spacing);
                    pos = posSign * margin;
                    index = 0;
                }
            } else {
                node = node->sibling();
            }
        }
    }
}